

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

JsonNull * __thiscall json::JsonArray::setNull(JsonArray *this,size_t index)

{
  JsonNull *pJVar1;
  unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *this_00;
  reference this_01;
  type this_02;
  unique_ptr<json::JsonNull,_std::default_delete<json::JsonNull>_> local_20;
  size_t local_18;
  size_t index_local;
  JsonArray *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  pJVar1 = (JsonNull *)operator_new(0x10);
  JsonNull::JsonNull(pJVar1,&this->super_JsonNode);
  std::unique_ptr<json::JsonNull,std::default_delete<json::JsonNull>>::
  unique_ptr<std::default_delete<json::JsonNull>,void>
            ((unique_ptr<json::JsonNull,std::default_delete<json::JsonNull>> *)&local_20,pJVar1);
  this_00 = (unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)
            std::
            vector<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
            ::operator[](&this->children,local_18);
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::operator=(this_00,&local_20);
  std::unique_ptr<json::JsonNull,_std::default_delete<json::JsonNull>_>::~unique_ptr(&local_20);
  this_01 = std::
            vector<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>,_std::allocator<std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>_>_>
            ::operator[](&this->children,local_18);
  this_02 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (this_01);
  pJVar1 = JsonNode::operator_cast_to_JsonNull_(this_02);
  return pJVar1;
}

Assistant:

JsonNull &JsonArray::setNull(size_t index)
    {
        children[index] = std::unique_ptr<JsonNull>(new JsonNull(this));
        return *children[index];
    }